

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

void address_space_stw_be_riscv32
               (uc_struct_conflict12 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion_conflict *mr;
  ushort *puVar2;
  hwaddr addr1;
  hwaddr l;
  hwaddr local_38;
  hwaddr local_30;
  
  local_30 = 2;
  mr = flatview_translate_riscv32(uc,as->current_map,addr,&local_38,&local_30,true,attrs);
  if (((local_30 < 2) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_riscv32(uc,mr,local_38,(ulong)val,MO_BEUW,attrs);
  }
  else {
    puVar2 = (ushort *)qemu_map_ram_ptr_riscv32(mr->uc,mr->ram_block,local_38);
    *puVar2 = (ushort)val << 8 | (ushort)val >> 8;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stw_be, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stw_internal, SUFFIX)(uc, ARG1, addr, val, attrs, result,
                               DEVICE_BIG_ENDIAN);
}